

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool is_test_only(uint32_t counter,uint32_t period,uint32_t after,bool holdout_off,
                 uint32_t target_modulus)

{
  uint32_t target_modulus_local;
  bool holdout_off_local;
  uint32_t after_local;
  uint32_t period_local;
  uint32_t counter_local;
  undefined1 local_1;
  
  if (holdout_off) {
    local_1 = false;
  }
  else if (after == 0) {
    local_1 = counter % period == target_modulus;
  }
  else {
    local_1 = after <= counter;
  }
  return local_1;
}

Assistant:

bool is_test_only(uint32_t counter, uint32_t period, uint32_t after, bool holdout_off,
    uint32_t target_modulus)  // target should be 0 in the normal case, or period-1 in the case that emptylines separate
                              // examples
{
  if (holdout_off)
    return false;
  if (after == 0)  // hold out by period
    return (counter % period == target_modulus);
  else  // hold out by position
    return (counter >= after);
}